

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O1

void anon_unknown.dwarf_1f65f7::fillPixels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,Array2D<Imath_3_2::half_*> *ph,int width,
               int height)

{
  long lVar1;
  char cVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  half **pphVar5;
  half *phVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  short sVar13;
  float fVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  short sVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar22;
  int iVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  int iVar33;
  int iVar34;
  undefined1 auVar32 [16];
  int iVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ulong local_c0;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  
  lVar7 = (long)width;
  uVar4 = height * lVar7;
  pphVar5 = (half **)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
  if (ph->_data != (half **)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = lVar7;
  ph->_data = pphVar5;
  if (0 < height) {
    lVar1 = sampleCount->_sizeY;
    local_c0 = 0;
    do {
      if (0 < width) {
        lVar10 = lVar1 * local_c0;
        uVar4 = 0;
        do {
          phVar6 = (half *)operator_new__((ulong)sampleCount->_data[lVar10 + uVar4] * 2);
          ph->_data[local_c0 * lVar7 + uVar4] = phVar6;
          uVar8 = (ulong)sampleCount->_data[lVar10 + uVar4];
          if (uVar8 != 0) {
            fVar14 = (float)((uint)((int)local_c0 * width + (int)uVar4) % 0x801);
            uVar12 = (uint)fVar14 & 0x7fffff | 0x800000;
            cVar2 = (char)((uint)fVar14 >> 0x17);
            uVar11 = (uint)fVar14 >> 0xd & 0x3ff;
            auVar16._8_4_ = 0xffffffff;
            auVar16._0_8_ = 0xffffffffffffffff;
            auVar16._12_4_ = 0xffffffff;
            if (uVar12 << (cVar2 + 0xa2U & 0x1f) < 0x80000001) {
              auVar16 = pshuflw(ZEXT116(0),ZEXT116(0),0);
              uVar15 = auVar16._0_4_;
              auVar16._4_4_ = uVar15;
              auVar16._0_4_ = uVar15;
              auVar16._8_4_ = uVar15;
              auVar16._12_4_ = uVar15;
            }
            uStack_5c = 0x7c007c00;
            if ((uint)fVar14 < 0x477ff000) {
              auVar17 = ZEXT416((int)fVar14 + 0x8000fff + (uint)(((uint)fVar14 >> 0xd & 1) != 0) >>
                                0xd);
              auVar17 = pshuflw(auVar17,auVar17,0);
              uStack_5c = auVar17._0_4_;
            }
            uStack_6c = 0x7c007c00;
            if (fVar14 != INFINITY) {
              auVar17 = ZEXT416(uVar11 | uVar11 == 0 | 0x7c00);
              auVar17 = pshuflw(auVar17,auVar17,0);
              uStack_6c = auVar17._0_4_;
            }
            phVar6 = ph->_data[local_c0 * lVar7 + uVar4];
            lVar40 = uVar8 - 1;
            auVar32._8_4_ = (int)lVar40;
            auVar32._0_8_ = lVar40;
            auVar32._12_4_ = (int)((ulong)lVar40 >> 0x20);
            auVar17 = pshuflw(ZEXT116(0x387fffff < (uint)fVar14),ZEXT116(0x387fffff < (uint)fVar14),
                              0);
            uVar15 = auVar17._0_4_;
            auVar38._4_4_ = uVar15;
            auVar38._0_4_ = uVar15;
            auVar38._8_4_ = uVar15;
            auVar38._12_4_ = uVar15;
            auVar17 = pshuflw(ZEXT116((uint)fVar14 < 0x33000001),ZEXT116((uint)fVar14 < 0x33000001),
                              0);
            uVar15 = auVar17._0_4_;
            auVar39._4_4_ = uVar15;
            auVar39._0_4_ = uVar15;
            auVar39._8_4_ = uVar15;
            auVar39._12_4_ = uVar15;
            auVar17 = ZEXT416(uVar12 >> (0x7eU - cVar2 & 0x1f));
            auVar17 = pshuflw(auVar17,auVar17,0);
            auVar23 = pshuflw(ZEXT116(0x7f7fffff < (uint)fVar14),ZEXT116(0x7f7fffff < (uint)fVar14),
                              0);
            uVar15 = auVar23._0_4_;
            auVar36._8_4_ = 0xffffffff;
            auVar36._0_8_ = 0xffffffffffffffff;
            auVar36._12_4_ = 0xffffffff;
            auVar16 = auVar16 & _DAT_001c0d00;
            sVar13 = auVar17._0_2_;
            auVar37._0_2_ = auVar16._0_2_ + sVar13;
            sVar21 = auVar17._2_2_;
            auVar37._2_2_ = auVar16._2_2_ + sVar21;
            auVar37._4_2_ = auVar16._4_2_ + sVar13;
            auVar37._6_2_ = auVar16._6_2_ + sVar21;
            auVar37._8_2_ = auVar16._8_2_ + sVar13;
            auVar37._10_2_ = auVar16._10_2_ + sVar21;
            auVar37._12_2_ = auVar16._12_2_ + sVar13;
            auVar37._14_2_ = auVar16._14_2_ + sVar21;
            auVar17._4_4_ = uVar15;
            auVar17._0_4_ = uVar15;
            auVar17._8_4_ = uVar15;
            auVar17._12_4_ = uVar15;
            auVar32 = auVar32 ^ _DAT_001bcaf0;
            uVar9 = 0;
            auVar23 = _DAT_001bcae0;
            auVar41 = _DAT_001bdfa0;
            auVar42 = _DAT_001bdf90;
            auVar43 = _DAT_001bdf80;
            do {
              auVar16 = auVar23 ^ _DAT_001bcaf0;
              iVar31 = auVar32._0_4_;
              iVar22 = -(uint)(iVar31 < auVar16._0_4_);
              iVar33 = auVar32._4_4_;
              auVar24._4_4_ = -(uint)(iVar33 < auVar16._4_4_);
              iVar34 = auVar32._8_4_;
              iVar27 = -(uint)(iVar34 < auVar16._8_4_);
              iVar35 = auVar32._12_4_;
              auVar24._12_4_ = -(uint)(iVar35 < auVar16._12_4_);
              auVar28._4_4_ = iVar22;
              auVar28._0_4_ = iVar22;
              auVar28._8_4_ = iVar27;
              auVar28._12_4_ = iVar27;
              auVar50._4_4_ = -(uint)(auVar16._4_4_ == iVar33);
              auVar50._12_4_ = -(uint)(auVar16._12_4_ == iVar35);
              auVar50._0_4_ = auVar50._4_4_;
              auVar50._8_4_ = auVar50._12_4_;
              auVar24._0_4_ = auVar24._4_4_;
              auVar24._8_4_ = auVar24._12_4_;
              auVar16 = auVar41 ^ _DAT_001bcaf0;
              iVar22 = -(uint)(iVar31 < auVar16._0_4_);
              auVar29._4_4_ = -(uint)(iVar33 < auVar16._4_4_);
              iVar27 = -(uint)(iVar34 < auVar16._8_4_);
              auVar29._12_4_ = -(uint)(iVar35 < auVar16._12_4_);
              auVar44._4_4_ = iVar22;
              auVar44._0_4_ = iVar22;
              auVar44._8_4_ = iVar27;
              auVar44._12_4_ = iVar27;
              auVar18._4_4_ = -(uint)(auVar16._4_4_ == iVar33);
              auVar18._12_4_ = -(uint)(auVar16._12_4_ == iVar35);
              auVar18._0_4_ = auVar18._4_4_;
              auVar18._8_4_ = auVar18._12_4_;
              auVar29._0_4_ = auVar29._4_4_;
              auVar29._8_4_ = auVar29._12_4_;
              auVar25 = packssdw(auVar24 | auVar50 & auVar28,auVar29 | auVar18 & auVar44);
              auVar26._8_4_ = 0xffffffff;
              auVar26._0_8_ = 0xffffffffffffffff;
              auVar26._12_4_ = 0xffffffff;
              auVar16 = auVar42 ^ _DAT_001bcaf0;
              iVar22 = -(uint)(iVar31 < auVar16._0_4_);
              auVar30._4_4_ = -(uint)(iVar33 < auVar16._4_4_);
              iVar27 = -(uint)(iVar34 < auVar16._8_4_);
              auVar30._12_4_ = -(uint)(iVar35 < auVar16._12_4_);
              auVar45._4_4_ = iVar22;
              auVar45._0_4_ = iVar22;
              auVar45._8_4_ = iVar27;
              auVar45._12_4_ = iVar27;
              auVar19._4_4_ = -(uint)(auVar16._4_4_ == iVar33);
              auVar19._12_4_ = -(uint)(auVar16._12_4_ == iVar35);
              auVar19._0_4_ = auVar19._4_4_;
              auVar19._8_4_ = auVar19._12_4_;
              auVar30._0_4_ = auVar30._4_4_;
              auVar30._8_4_ = auVar30._12_4_;
              auVar16 = auVar43 ^ _DAT_001bcaf0;
              iVar22 = -(uint)(iVar31 < auVar16._0_4_);
              auVar46._4_4_ = -(uint)(iVar33 < auVar16._4_4_);
              iVar27 = -(uint)(iVar34 < auVar16._8_4_);
              auVar46._12_4_ = -(uint)(iVar35 < auVar16._12_4_);
              auVar48._4_4_ = iVar22;
              auVar48._0_4_ = iVar22;
              auVar48._8_4_ = iVar27;
              auVar48._12_4_ = iVar27;
              auVar20._4_4_ = -(uint)(auVar16._4_4_ == iVar33);
              auVar20._12_4_ = -(uint)(auVar16._12_4_ == iVar35);
              auVar20._0_4_ = auVar20._4_4_;
              auVar20._8_4_ = auVar20._12_4_;
              auVar46._0_4_ = auVar46._4_4_;
              auVar46._8_4_ = auVar46._12_4_;
              auVar16 = packssdw(auVar30 | auVar19 & auVar45,auVar46 | auVar20 & auVar48);
              auVar47._8_4_ = 0xffffffff;
              auVar47._0_8_ = 0xffffffffffffffff;
              auVar47._12_4_ = 0xffffffff;
              auVar26 = packssdw(auVar25 ^ auVar26,auVar16 ^ auVar47);
              auVar16 = auVar26 & (auVar38 ^ auVar36);
              auVar47 = auVar16 & (auVar39 ^ auVar36);
              auVar49 = auVar26 & auVar38 & (auVar36 ^ auVar17);
              auVar25 = psllw(auVar49,0xf);
              auVar50 = psraw(auVar25,0xf);
              auVar25._4_4_ = uVar15;
              auVar25._0_4_ = uVar15;
              auVar25._8_4_ = uVar15;
              auVar25._12_4_ = uVar15;
              auVar25 = auVar26 & auVar38 & auVar25;
              auVar26 = psllw(auVar25,0xf);
              auVar26 = psraw(auVar26,0xf);
              auVar3._4_4_ = uStack_6c;
              auVar3._0_4_ = uStack_6c;
              auVar3._8_4_ = uStack_6c;
              auVar3._12_4_ = uStack_6c;
              auVar16 = auVar16 & auVar39 | auVar25 | auVar47 | auVar49;
              auVar49._4_4_ = uStack_5c;
              auVar49._0_4_ = uStack_5c;
              auVar49._8_4_ = uStack_5c;
              auVar49._12_4_ = uStack_5c;
              auVar47 = psllw(auVar47,0xf);
              auVar47 = psraw(auVar47,0xf);
              auVar26 = ~auVar47 & (~auVar50 & auVar26 & auVar3 | auVar49 & auVar50) |
                        auVar37 & auVar47;
              if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)((long)&phVar6->_h + uVar9) = auVar26._0_2_;
              }
              if ((auVar16._0_4_ >> 0x10 & 1) != 0) {
                *(short *)((long)&phVar6[1]._h + uVar9) = auVar26._2_2_;
              }
              if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(short *)((long)&phVar6[2]._h + uVar9) = auVar26._4_2_;
              }
              if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(short *)((long)&phVar6[3]._h + uVar9) = auVar26._6_2_;
              }
              if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)((long)&phVar6[4]._h + uVar9) = auVar26._8_2_;
              }
              if ((auVar16 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(short *)((long)&phVar6[5]._h + uVar9) = auVar26._10_2_;
              }
              if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(short *)((long)&phVar6[6]._h + uVar9) = auVar26._12_2_;
              }
              if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(short *)((long)&phVar6[7]._h + uVar9) = auVar26._14_2_;
              }
              lVar40 = auVar23._8_8_;
              auVar23._0_8_ = auVar23._0_8_ + 8;
              auVar23._8_8_ = lVar40 + 8;
              lVar40 = auVar41._8_8_;
              auVar41._0_8_ = auVar41._0_8_ + 8;
              auVar41._8_8_ = lVar40 + 8;
              lVar40 = auVar42._8_8_;
              auVar42._0_8_ = auVar42._0_8_ + 8;
              auVar42._8_8_ = lVar40 + 8;
              lVar40 = auVar43._8_8_;
              auVar43._0_8_ = auVar43._0_8_ + 8;
              auVar43._8_8_ = lVar40 + 8;
              uVar9 = uVar9 + 0x10;
            } while ((uVar8 * 2 + 0xe & 0xfffffffffffffff0) != uVar9);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != (uint)width);
      }
      local_c0 = local_c0 + 1;
    } while (local_c0 != (uint)height);
  }
  return;
}

Assistant:

void
fillPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}